

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_texture_thumbnail.cxx
# Opt level: O0

void __thiscall xray_re::xr_texture_thumbnail::load(xr_texture_thumbnail *this,xr_reader *r)

{
  xr_reader *this_00;
  uint8_t uVar1;
  et_format eVar2;
  uint32_t uVar3;
  int32_t iVar4;
  et_type eVar5;
  et_material eVar6;
  et_bump_mode eVar7;
  size_t sVar8;
  uint8_t *puVar9;
  float fVar10;
  uint local_2c;
  xr_reader *pxStack_28;
  uint32_t thm_type;
  xr_reader *s;
  bool compressed;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_texture_thumbnail *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar8 = xr_reader::r_chunk<unsigned_short>(r,0x810,(unsigned_short *)((long)&s + 6));
  if (sVar8 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x12,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  if (s._6_2_ != 0x12) {
    __assert_fail("version == THM_VERSION_TEXTUREPARAM",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x13,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  s._5_1_ = 0;
  sVar8 = xr_reader::find_chunk(pxStack_18,0x811,(bool *)((long)&s + 5),true);
  if (sVar8 != 0) {
    pxStack_28 = xr_reader::open_chunk(pxStack_18,0x811);
    sVar8 = xr_reader::size(pxStack_28);
    puVar9 = (uint8_t *)operator_new__(sVar8);
    this_00 = pxStack_28;
    this->data = puVar9;
    puVar9 = this->data;
    sVar8 = xr_reader::size(pxStack_28);
    xr_reader::r_raw(this_00,puVar9,sVar8);
    xr_reader::close_chunk(pxStack_18,&stack0xffffffffffffffd8);
  }
  sVar8 = xr_reader::r_chunk<unsigned_int>(pxStack_18,0x813,&local_2c);
  if (sVar8 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x1e,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  if (local_2c != 1) {
    __assert_fail("thm_type == THM_TYPE_TEXTURE",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x1f,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  sVar8 = xr_reader::find_chunk(pxStack_18,0x812);
  if (sVar8 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_texture_thumbnail.cxx"
                  ,0x22,"void xray_re::xr_texture_thumbnail::load(xr_reader &)");
  }
  eVar2 = xr_reader::r_u32(pxStack_18);
  this->fmt = eVar2;
  uVar3 = xr_reader::r_u32(pxStack_18);
  this->flags = uVar3;
  uVar3 = xr_reader::r_u32(pxStack_18);
  this->border_color = uVar3;
  uVar3 = xr_reader::r_u32(pxStack_18);
  this->fade_color = uVar3;
  uVar3 = xr_reader::r_u32(pxStack_18);
  this->fade_amount = uVar3;
  uVar3 = xr_reader::r_u32(pxStack_18);
  this->mip_filter = uVar3;
  iVar4 = xr_reader::r_s32(pxStack_18);
  this->width = iVar4;
  iVar4 = xr_reader::r_s32(pxStack_18);
  this->height = iVar4;
  xr_reader::debug_find_chunk(pxStack_18);
  sVar8 = xr_reader::find_chunk(pxStack_18,0x814);
  if (sVar8 != 0) {
    eVar5 = xr_reader::r_u32(pxStack_18);
    this->type = eVar5;
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar8 = xr_reader::find_chunk(pxStack_18,0x815);
  if (sVar8 != 0) {
    xr_reader::r_sz(pxStack_18,&this->detail_name);
    fVar10 = xr_reader::r_float(pxStack_18);
    this->detail_scale = fVar10;
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar8 = xr_reader::find_chunk(pxStack_18,0x816);
  if (sVar8 != 0) {
    eVar6 = xr_reader::r_u32(pxStack_18);
    this->material = eVar6;
    fVar10 = xr_reader::r_float(pxStack_18);
    this->material_weight = fVar10;
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar8 = xr_reader::find_chunk(pxStack_18,0x817);
  if (sVar8 != 0) {
    fVar10 = xr_reader::r_float(pxStack_18);
    this->bump_virtual_height = fVar10;
    eVar7 = xr_reader::r_u32(pxStack_18);
    this->bump_mode = eVar7;
    if (this->bump_mode == tbm_reserved) {
      this->bump_mode = tbm_none;
    }
    xr_reader::r_sz(pxStack_18,&this->bump_name);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar8 = xr_reader::find_chunk(pxStack_18,0x818);
  if (sVar8 != 0) {
    xr_reader::r_sz(pxStack_18,&this->ext_normal_map_name);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar8 = xr_reader::find_chunk(pxStack_18,0x819);
  if (sVar8 != 0) {
    uVar1 = xr_reader::r_u8(pxStack_18);
    this->fade_delay = uVar1;
    xr_reader::debug_find_chunk(pxStack_18);
  }
  return;
}

Assistant:

void xr_texture_thumbnail::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(THM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == THM_VERSION_TEXTUREPARAM);

	bool compressed = false;
	if (r.find_chunk(THM_CHUNK_DATA, &compressed)) {
		xr_reader* s = r.open_chunk(THM_CHUNK_DATA);
		data = new uint8_t[s->size()];
		s->r_raw(data, s->size());
		r.close_chunk(s);
	}
	uint32_t thm_type;
	if (!r.r_chunk(THM_CHUNK_TYPE, thm_type))
		xr_not_expected();
	xr_assert(thm_type == THM_TYPE_TEXTURE);

	if (!r.find_chunk(THM_CHUNK_TEXTUREPARAM))
		xr_not_expected();
	fmt = static_cast<et_format>(r.r_u32());
	flags = r.r_u32();
	border_color = r.r_u32();
	fade_color = r.r_u32();
	fade_amount = r.r_u32();
	mip_filter = r.r_u32();
	width = r.r_s32();
	height = r.r_s32();
	r.debug_find_chunk();

	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_TYPE)) {
		type = static_cast<et_type>(r.r_u32());
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_DETAIL)) {
		r.r_sz(detail_name);
		detail_scale = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_MATERIAL)) {
		material = static_cast<et_material>(r.r_u32());
		material_weight = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_BUMP)) {
		bump_virtual_height = r.r_float();
		bump_mode = static_cast<et_bump_mode>(r.r_u32());
		if (bump_mode == tbm_reserved)
			bump_mode = tbm_none;
		r.r_sz(bump_name);
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_NMAP)) {
		r.r_sz(ext_normal_map_name);
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_TEXTUREPARAM_FADE)) {
		fade_delay = r.r_u8();
		r.debug_find_chunk();
	}
}